

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgroupbox.cpp
# Opt level: O3

void QGroupBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *title;
  undefined8 *puVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QArrayData *pQVar5;
  code *pcVar6;
  long lVar7;
  undefined1 uVar8;
  int iVar9;
  long in_FS_OFFSET;
  undefined1 local_29;
  void *local_28;
  undefined1 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_29 = *_a[1];
      break;
    case 1:
      local_29 = 0;
      break;
    case 2:
      local_29 = *_a[1];
      iVar9 = 2;
      goto LAB_0040bf63;
    case 3:
      uVar8 = *_a[1];
LAB_0040bf11:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setChecked((QGroupBox *)_o,(bool)uVar8);
        return;
      }
      goto LAB_0040bf92;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QGroupBoxPrivate::_q_setChildrenEnabled(*(QGroupBoxPrivate **)(_o + 8),*_a[1]);
        return;
      }
      goto LAB_0040bf92;
    default:
      goto switchD_0040bcb3_caseD_3;
    }
    iVar9 = 0;
LAB_0040bf63:
    local_20 = &local_29;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar9,&local_28);
    break;
  case ReadProperty:
    if (4 < (uint)_id) break;
    puVar1 = (undefined8 *)*_a;
    switch(_id) {
    case 0:
      lVar7 = *(long *)(_o + 8);
      piVar2 = *(int **)(lVar7 + 600);
      uVar3 = *(undefined8 *)(lVar7 + 0x260);
      uVar4 = *(undefined8 *)(lVar7 + 0x268);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      pQVar5 = (QArrayData *)*puVar1;
      *puVar1 = piVar2;
      puVar1[1] = uVar3;
      puVar1[2] = uVar4;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
            QArrayData::deallocate(pQVar5,2,0x10);
            return;
          }
          goto LAB_0040bf92;
        }
      }
      break;
    case 1:
      *(undefined4 *)puVar1 = *(undefined4 *)(*(long *)(_o + 8) + 0x270);
      break;
    case 2:
      uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x278);
      goto LAB_0040bf3b;
    case 3:
      uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x279);
LAB_0040bf3b:
      *(undefined1 *)puVar1 = uVar8;
      break;
    case 4:
      if (*(char *)(*(long *)(_o + 8) + 0x279) == '\x01') {
        uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x27a);
      }
      else {
        uVar8 = 0;
      }
      *(undefined1 *)puVar1 = uVar8;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      title = (QString *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setTitle((QGroupBox *)_o,title);
          return;
        }
        break;
      case 1:
        *(undefined4 *)(*(long *)(_o + 8) + 0x270) = *(undefined4 *)&(title->d).d;
        QWidget::updateGeometry((QWidget *)_o);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          QWidget::update((QWidget *)_o);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setFlat((QGroupBox *)_o,*(bool *)&(title->d).d);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          setCheckable((QGroupBox *)_o,*(bool *)&(title->d).d);
          return;
        }
        break;
      case 4:
        uVar8 = *(undefined1 *)&(title->d).d;
        goto LAB_0040bf11;
      }
      goto LAB_0040bf92;
    }
    break;
  case IndexOfMethod:
    pcVar6 = *_a[1];
    lVar7 = *(long *)((long)_a[1] + 8);
    if (pcVar6 == clicked && lVar7 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar6 == toggled && lVar7 == 0) {
      *(undefined4 *)*_a = 2;
    }
  }
switchD_0040bcb3_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0040bf92:
  __stack_chk_fail();
}

Assistant:

void QGroupBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGroupBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->clicked(); break;
        case 2: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->setChecked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->d_func()->_q_setChildrenEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGroupBox::*)(bool )>(_a, &QGroupBox::clicked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGroupBox::*)(bool )>(_a, &QGroupBox::toggled, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->title(); break;
        case 1: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isFlat(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isCheckable(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isChecked(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTitle(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 2: _t->setFlat(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setCheckable(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setChecked(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}